

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O3

void http_sconn_cbdone(void *arg)

{
  nni_http_server *s;
  nni_http_handler *h;
  _Bool _Var1;
  nng_err nVar2;
  nng_http_status nVar3;
  int iVar4;
  char *pcVar5;
  char *__s1;
  
  s = *(nni_http_server **)((long)arg + 0x18);
  h = *(nni_http_handler **)((long)arg + 0x28);
  if (h != (nni_http_handler *)0x0) {
    *(undefined8 *)((long)arg + 0x28) = 0;
    nni_http_handler_fini(h);
  }
  nVar2 = nni_aio_result((nni_aio *)((long)arg + 0x48));
  if ((nVar2 == NNG_OK) && (*(nni_http_conn **)((long)arg + 0x10) != (nni_http_conn *)0x0)) {
    _Var1 = nni_http_res_sent(*(nni_http_conn **)((long)arg + 0x10));
    if (!_Var1) {
      pcVar5 = nni_http_get_header(*(nng_http **)((long)arg + 0x10),"Connection");
      nVar3 = nni_http_get_status(*(nng_http **)((long)arg + 0x10));
      __s1 = nni_http_get_method(*(nng_http **)((long)arg + 0x10));
      if (pcVar5 != (char *)0x0) {
        pcVar5 = strstr(pcVar5,"close");
        if (pcVar5 != (char *)0x0) {
          *(undefined1 *)((long)arg + 0x30) = 1;
        }
      }
      if (*(char *)((long)arg + 0x30) == '\x01') {
        nni_http_set_header(*(nng_http **)((long)arg + 0x10),"Connection","close");
      }
      iVar4 = strcmp(__s1,"HEAD");
      if ((iVar4 == 0) && (nVar3 - NNG_HTTP_STATUS_OK < 100)) {
        nni_http_prune_body(*(nng_http **)((long)arg + 0x10));
      }
      else {
        _Var1 = nni_http_is_error(*(nng_http **)((long)arg + 0x10));
        if (_Var1) {
          nni_http_server_error(s,*(nng_http **)((long)arg + 0x10));
        }
      }
      nni_http_write_res(*(nng_http **)((long)arg + 0x10),(nni_aio *)((long)arg + 0x3d8));
      return;
    }
    if (*(char *)((long)arg + 0x30) != '\x01') {
      *(undefined8 *)((long)arg + 0x20) = 0;
      nni_http_read_req(*(nni_http_conn **)((long)arg + 0x10),(nni_aio *)((long)arg + 0x210));
      return;
    }
  }
  http_sconn_close((http_sconn *)arg);
  return;
}

Assistant:

static void
http_sconn_cbdone(void *arg)
{
	http_sconn       *sc  = arg;
	nni_aio          *aio = &sc->cbaio;
	nni_http_handler *h;
	nni_http_server  *s = sc->server;

	// Get the handler.  It may be set regardless of success or
	// failure.  Clear it, and drop our reference, since we're
	// done with the handler for now.
	if ((h = sc->release) != NULL) {
		sc->release = NULL;
		nni_http_handler_fini(h);
	}

	if (nni_aio_result(aio) != 0) {
		// Hard close, no further feedback.
		http_sconn_close(sc);
		return;
	}

	// If it's an upgrader, and they didn't give us back a response,
	// it means that they took over, and we should just discard
	// this session, without closing the underlying channel.
	if (sc->conn == NULL) {
		// If this happens, then the session was hijacked.
		// We close the context, but the http channel stays up.
		http_sconn_close(sc);
		return;
	}
	if (!nni_http_res_sent(sc->conn)) {
		const char     *val;
		const char     *method;
		nng_http_status status;
		val    = nni_http_get_header(sc->conn, "Connection");
		status = nni_http_get_status(sc->conn);
		method = nni_http_get_method(sc->conn);
		if ((val != NULL) && (strstr(val, "close") != NULL)) {
			sc->close = true;
		}
		if (sc->close) {
			nni_http_set_header(sc->conn, "Connection", "close");
		}
		if ((strcmp(method, "HEAD") == 0) && status >= 200 &&
		    status <= 299) {
			// prune off data, preserving content-length header.
			nni_http_prune_body(sc->conn);
		} else if (nni_http_is_error(sc->conn)) {
			(void) nni_http_server_error(s, sc->conn);
		}
		nni_http_write_res(sc->conn, &sc->txaio);
	} else if (sc->close) {
		http_sconn_close(sc);
	} else {
		// Presumably client already sent a response.
		// Wait for another request.
		sc->handler = NULL;
		nni_http_read_req(sc->conn, &sc->rxaio);
	}
}